

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double pgamma(double x,double a)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double x_00;
  double __x;
  double local_88;
  double local_78;
  double local_70;
  double local_48;
  double local_30;
  double local_18;
  
  if (a < 0.0) {
    printf("a must be non-negative");
    exit(1);
  }
  x_00 = a;
  if (2e+20 < a) {
    dVar2 = 2e+20 / a;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    __x = 0.0;
    x_00 = 2e+20;
    x = (x - (a + -0.3333333333333333)) * dVar2 + 2e+20;
    if (x < 0.0) {
      bVar1 = true;
      goto LAB_00136dc9;
    }
  }
  __x = x;
  bVar1 = x_00 != 0.0;
  dVar2 = 0.0;
  if (((x_00 != 0.0) || (NAN(x_00))) && ((__x != 0.0 || (NAN(__x))))) {
    dVar2 = x_00 + 1.0;
    bVar1 = true;
    if (__x < dVar2) {
      dVar4 = 1.0;
      dVar5 = 1.0;
      local_18 = x_00;
      while( true ) {
        dVar6 = -dVar5;
        if (-dVar5 <= dVar5) {
          dVar6 = dVar5;
        }
        dVar3 = eps(dVar4);
        if (dVar6 < dVar3 * 100.0) break;
        local_18 = local_18 + 1.0;
        dVar5 = (dVar5 * __x) / local_18;
        dVar4 = dVar4 + dVar5;
      }
      dVar5 = log(__x);
      dVar2 = gamma_log(dVar2);
      dVar5 = exp((dVar5 * x_00 - __x) - dVar2);
      dVar2 = 1.0;
      if (dVar4 * dVar5 <= 1.0 || __x <= 0.0) {
        dVar2 = dVar4 * dVar5;
      }
    }
  }
LAB_00136dc9:
  if ((bVar1) && (x_00 + 1.0 <= __x)) {
    dVar5 = 1.0 / __x;
    local_48 = 0.0;
    local_18 = 1.0;
    local_88 = 1.0;
    local_78 = 1.0;
    dVar2 = dVar5;
    local_70 = dVar5;
    local_30 = __x;
    while( true ) {
      dVar4 = -dVar5;
      if (-dVar5 <= dVar5) {
        dVar4 = dVar5;
      }
      dVar6 = -dVar2;
      dVar5 = dVar6;
      if (dVar6 <= dVar2) {
        dVar5 = dVar2;
      }
      dVar5 = eps(dVar5);
      if (dVar4 < dVar5 * 100.0) break;
      local_88 = (local_88 * (local_18 - x_00) + local_30) * local_70;
      local_48 = (local_48 * (local_18 - x_00) + local_78) * local_70;
      local_30 = local_30 * local_70 * local_18 + __x * local_88;
      local_78 = __x * local_48 + local_70 * local_18 * local_78;
      local_70 = 1.0 / local_30;
      local_18 = local_18 + 1.0;
      dVar5 = local_78 * local_70 - dVar2;
      dVar2 = local_78 * local_70;
    }
    dVar2 = log(__x);
    dVar5 = gamma_log(x_00);
    dVar2 = exp((dVar2 * x_00 - __x) - dVar5);
    dVar2 = dVar2 * dVar6 + 1.0;
  }
  return (double)(-(ulong)(x_00 == 0.0) & 0x3ff0000000000000 |
                 ~-(ulong)(x_00 == 0.0) & ~-(ulong)(__x == 0.0) & (ulong)dVar2);
}

Assistant:

double pgamma(double x, double a) {
	double oup,ct,d,s,la;
	double a0,a1,b0,b1,g,g0,delta,fact;
	// Negative a
	if (a < 0.) {
		printf("a must be non-negative");
		exit(1);
	}
	
	// a -> inf
	la = 2.0e20;
	if (a > la) {
		x = la - 1.0/3.0 + sqrt(la/a)*(x - (a-1.0/3.0));
		a = la;
		if ( x < 0.0) {
			x = 0.0;
		}
	}
	
	// x < a + 1
	
	if ( a != 0 && x != 0 && x < a + 1) {
		ct = a;
		d = 1.;
		s = 1.;
		
		while (normf(d) >= 100*eps(s)) {
			ct += 1.0;
			d = x*d/ct;
			s += d;
		}
		oup = s * exp( -x + a * log(x) - gamma_log(a + 1));
		if ( x > 0 && oup > 1.) {
			oup = 1.0;
		}
	}
	
	if ( a != 0 && x >= a + 1) {
		a0 = 1.0;
		a1 = x;
		b0 = 0.0;
		b1 = 1.0;
		fact = 1.0/a1;
		ct = 1.0;
		g = b1 * fact;
		g0 = b0;
		delta = normf(g - g0);
		
		while (delta >= 100*eps(normf(g))) {
			g0 = g;
			d = ct - a;
			a0 = (a1 + a0*d)*fact;
			b0 = (b1 + b0*d)*fact;
			s = ct*fact;
			a1 = x * a0 + s * a1;
			b1 = x * b0 + s * b1;
			fact = 1.0/a1;
			ct += 1.0;
			g = b1 * fact;
			delta = normf(g - g0);
			
		}
		oup = 1.0 - g * exp( -x + a * log(x) - gamma_log(a));
		
	}
	
	if ( x == 0) {
		oup = 0.0;
	}
	
	if ( a == 0) {
		oup = 1.0;
	}
	
	
	return oup;
}